

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

Type __thiscall wasm::WasmBinaryReader::getConcreteType(WasmBinaryReader *this)

{
  int32_t code;
  Type TVar1;
  string local_40;
  
  code = getS32LEB(this);
  TVar1 = getType(this,code);
  if (1 < TVar1.id) {
    return (Type)TVar1.id;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"non-concrete type when one expected","");
  throwError(this,&local_40);
}

Assistant:

Type WasmBinaryReader::getConcreteType() {
  auto type = getType();
  if (!type.isConcrete()) {
    throwError("non-concrete type when one expected");
  }
  return type;
}